

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_reduce_root_p_tree_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  undefined8 *puVar1;
  int iVar2;
  bsc_step_t bVar3;
  long lVar4;
  double dVar5;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
  }
  else {
    iVar2 = *group;
  }
  dVar5 = (double)iVar2;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar5 = ceil(dVar5);
  bVar3 = depends;
  if (0 < n) {
    lVar4 = 0;
    do {
      puVar1 = (undefined8 *)((long)&params->reducer + lVar4);
      bVar3 = bsc_reduce_qtree_single
                        (depends,root,group,*(void **)((long)&params->src + lVar4),
                         *(void **)((long)&params->dst + lVar4),
                         *(void **)((long)&params->tmp + lVar4),(bsc_reduce_t)*puVar1,
                         (void *)puVar1[1],*(bsc_size_t *)((long)&params->nmemb + lVar4),
                         *(bsc_size_t *)((long)&params->size + lVar4),(int)dVar5);
      lVar4 = lVar4 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar4);
  }
  return bVar3;
}

Assistant:

bsc_step_t bsc_reduce_root_p_tree_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs(), root_P = (bsc_pid_t) ceil(sqrt(P));
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_reduce_qtree_single( depends, root, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, root_P );
    }

    return finished;
}